

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::eqI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *other_local;
  Literal *this_local;
  
  compare<16,_&wasm::Literal::getLanesUI8x16,_&wasm::Literal::eq,_int>
            (__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::eqI8x16(const Literal& other) const {
  return compare<16, &Literal::getLanesUI8x16, &Literal::eq>(*this, other);
}